

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O1

deSocket * deSocket_accept(deSocket *sock,deSocketAddress *clientAddress)

{
  int __fd;
  deSocket *pdVar1;
  deMutex dVar2;
  int addrLen;
  NativeSocklen bsdAddrLen;
  deUint8 bsdAddrBuf [28];
  socklen_t local_3c;
  sockaddr local_38;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  local_3c = 0x1c;
  local_38.sa_family = 0;
  local_38.sa_data[0] = '\0';
  local_38.sa_data[1] = '\0';
  local_38.sa_data[2] = '\0';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\0';
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  uStack_28 = 0;
  uStack_24 = 0;
  __fd = accept(sock->handle,&local_38,&local_3c);
  if (__fd != -1) {
    pdVar1 = (deSocket *)deCalloc(0x18);
    if (pdVar1 != (deSocket *)0x0) {
      dVar2 = deMutex_create((deMutexAttributes *)0x0);
      pdVar1->stateLock = dVar2;
      pdVar1->handle = __fd;
      pdVar1->state = DE_SOCKETSTATE_CONNECTED;
      pdVar1->openChannels = 3;
      if (clientAddress == (deSocketAddress *)0x0) {
        return pdVar1;
      }
      deBsdAddressToSocketAddress(clientAddress,(sockaddr *)&local_38,addrLen);
      return pdVar1;
    }
    close(__fd);
  }
  return (deSocket *)0x0;
}

Assistant:

deSocket* deSocket_accept (deSocket* sock, deSocketAddress* clientAddress)
{
	deSocketHandle		newFd		= DE_INVALID_SOCKET_HANDLE;
	deSocket*			newSock		= DE_NULL;
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen	= (NativeSocklen)sizeof(bsdAddrBuf);

	deMemset(bsdAddr, 0, (size_t)bsdAddrLen);

	newFd = accept(sock->handle, bsdAddr, &bsdAddrLen);
	if (!deSocketHandleIsValid(newFd))
		return DE_NULL;

	newSock = (deSocket*)deCalloc(sizeof(deSocket));
	if (!newSock)
	{
#if defined(DE_USE_WINSOCK)
		closesocket(newFd);
#else
		close(newFd);
#endif
		return DE_NULL;
	}

	newSock->stateLock		= deMutex_create(0);
	newSock->handle			= newFd;
	newSock->state			= DE_SOCKETSTATE_CONNECTED;
	newSock->openChannels	= DE_SOCKETCHANNEL_BOTH;

	if (clientAddress)
		deBsdAddressToSocketAddress(clientAddress, bsdAddr, (int)bsdAddrLen);

	return newSock;
}